

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_xdr.h
# Opt level: O0

void priv_from_native64(void *ptr,int n)

{
  int n_local;
  void *ptr_local;
  
  return;
}

Assistant:

static inline void
priv_from_native64 (void* ptr, int n)
{
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
    uint64_t* vals = (uint64_t*) ptr;
    for (int i = 0; i < n; ++i)
        vals[i] = htole64 (vals[i]);
#else
    (void) ptr;
    (void) n;
#endif
}